

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::CompileShaderCase::test(CompileShaderCase *this)

{
  CallLogWrapper *this_00;
  ShaderType shaderType;
  bool bVar1;
  deUint32 type;
  GLuint shader;
  char *pcVar2;
  TestError *this_01;
  char *shaderSource;
  char *local_20;
  
  shaderType = this->m_shaderType;
  pcVar2 = (char *)0x0;
  if (shaderType == SHADERTYPE_FRAGMENT) {
    pcVar2 = "void main (void) { gl_FragColor = vec4(0.0); }\n";
  }
  local_20 = "void main (void) { gl_Position = vec4(0.0); }\n";
  if (shaderType != SHADERTYPE_VERTEX) {
    local_20 = pcVar2;
  }
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  type = glu::getGLShaderType(shaderType);
  shader = glu::CallLogWrapper::glCreateShader(this_00,type);
  if (shader == 0) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"shaderObject != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
               ,0x174);
  }
  else {
    glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_20,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,shader);
    bVar1 = checkCompileStatus(this,shader);
    if (bVar1) {
      glu::CallLogWrapper::glDeleteShader(this_00,shader);
      return;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"checkCompileStatus(shaderObject)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderApiTests.cpp"
               ,0x179);
  }
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void test (void)
	{
		const char*		shaderSource	= getSimpleShaderSource(m_shaderType);
		const GLuint	shaderObject	= glCreateShader(glu::getGLShaderType(m_shaderType));

		TCU_CHECK(shaderObject != 0);

		glShaderSource(shaderObject, 1, &shaderSource, 0);
		glCompileShader(shaderObject);

		TCU_CHECK(checkCompileStatus(shaderObject));

		glDeleteShader(shaderObject);
	}